

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

void __thiscall
backward::Printer::print_source_loc
          (Printer *this,ostream *os,char *indent,SourceLoc *source_loc,void *addr)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,indent);
  poVar1 = std::operator<<(poVar1,"Source \"");
  poVar1 = std::operator<<(poVar1,(string *)&source_loc->filename);
  poVar1 = std::operator<<(poVar1,"\", line ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", in ");
  std::operator<<(poVar1,(string *)source_loc);
  if ((addr != (void *)0x0) && (this->address != false)) {
    poVar1 = std::operator<<(os," [");
    poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
    std::operator<<(poVar1,"]");
  }
  std::operator<<(os,"\n");
  return;
}

Assistant:

void print_source_loc(std::ostream &os, const char *indent,
                        const ResolvedTrace::SourceLoc &source_loc,
                        void *addr = nullptr) {
    os << indent << "Source \"" << source_loc.filename << "\", line "
       << source_loc.line << ", in " << source_loc.function;

    if (address && addr != nullptr) {
      os << " [" << addr << "]";
    }
    os << "\n";
  }